

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cVertexAttribBindingTests.cpp
# Opt level: O0

bool __thiscall
glcts::anon_unknown_0::VertexAttribBindingBase::CheckFB
          (VertexAttribBindingBase *this,Vec3 *expected)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  int iVar9;
  int iVar10;
  RenderContext *pRVar11;
  undefined4 extraout_var;
  PixelFormat *pPVar12;
  reference pixels;
  byte *pbVar13;
  float *pfVar14;
  uint local_88;
  uint local_84;
  GLint x;
  GLint y;
  GLint i;
  int fb_h;
  int fb_w;
  allocator<unsigned_char> local_61;
  undefined1 local_60 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> fb;
  Vec3 g_color_max;
  Vec3 g_color_eps;
  PixelFormat *pixelFormat;
  RenderTarget *renderTarget;
  Vec3 *expected_local;
  VertexAttribBindingBase *this_local;
  
  pRVar11 = deqp::Context::getRenderContext((this->super_SubcaseBase).super_GLWrapper.m_context);
  iVar9 = (*pRVar11->_vptr_RenderContext[4])();
  pPVar12 = tcu::RenderTarget::getPixelFormat((RenderTarget *)CONCAT44(extraout_var,iVar9));
  tcu::Vector<float,_3>::Vector
            ((Vector<float,_3> *)(g_color_max.m_data + 1),
             1.0 / (float)(1 << ((byte)pPVar12->redBits & 0x1f)),
             1.0 / (float)(1 << ((byte)pPVar12->greenBits & 0x1f)),
             1.0 / (float)(1 << ((byte)pPVar12->blueBits & 0x1f)));
  tcu::Vector<float,_3>::Vector
            ((Vector<float,_3> *)
             &fb.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,255.0);
  iVar9 = getWindowWidth(this);
  iVar10 = getWindowHeight(this);
  std::allocator<unsigned_char>::allocator(&local_61);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_60,
             (long)(iVar9 * iVar10 * 4),&local_61);
  std::allocator<unsigned_char>::~allocator(&local_61);
  iVar9 = getWindowWidth(this);
  iVar10 = getWindowHeight(this);
  pixels = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_60,0);
  glu::CallLogWrapper::glReadPixels
            (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,0,0,iVar9,iVar10,0x1908
             ,0x1401,pixels);
  x = 0;
  local_84 = 0;
  do {
    if (iVar10 <= (int)local_84) {
      this_local._7_1_ = true;
LAB_013f9fef:
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_60);
      return this_local._7_1_;
    }
    for (local_88 = 0; (int)local_88 < iVar9; local_88 = local_88 + 1) {
      pbVar13 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_60,(long)x
                          );
      bVar6 = *pbVar13;
      pfVar14 = tcu::Vector<float,_3>::operator[]
                          ((Vector<float,_3> *)
                           &fb.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage,0);
      fVar1 = *pfVar14;
      pfVar14 = tcu::Vector<float,_3>::operator[](expected,0);
      fVar2 = *pfVar14;
      pfVar14 = tcu::Vector<float,_3>::operator[]((Vector<float,_3> *)(g_color_max.m_data + 1),0);
      if (*pfVar14 < ABS((float)bVar6 / fVar1 - fVar2)) {
LAB_013f9d94:
        pbVar13 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_60,
                             (long)x);
        bVar6 = *pbVar13;
        pfVar14 = tcu::Vector<float,_3>::operator[]
                            ((Vector<float,_3> *)
                             &fb.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage,0);
        fVar1 = *pfVar14;
        pbVar13 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_60,
                             (long)(x + 1));
        bVar7 = *pbVar13;
        pfVar14 = tcu::Vector<float,_3>::operator[]
                            ((Vector<float,_3> *)
                             &fb.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage,1);
        fVar2 = *pfVar14;
        pbVar13 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_60,
                             (long)(x + 2));
        bVar8 = *pbVar13;
        pfVar14 = tcu::Vector<float,_3>::operator[]
                            ((Vector<float,_3> *)
                             &fb.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage,2);
        fVar3 = *pfVar14;
        pfVar14 = tcu::Vector<float,_3>::operator[](expected,0);
        fVar4 = *pfVar14;
        pfVar14 = tcu::Vector<float,_3>::operator[](expected,1);
        fVar5 = *pfVar14;
        pfVar14 = tcu::Vector<float,_3>::operator[](expected,2);
        anon_unknown_0::Output
                  ("Incorrect framebuffer color at pixel (%d %d). Color is (%f %f %f). Color should be (%f %f %f).\n"
                   ,(double)((float)bVar6 / fVar1),SUB84((double)((float)bVar7 / fVar2),0),
                   (double)((float)bVar8 / fVar3),(double)fVar4,(double)fVar5,(double)*pfVar14,
                   (ulong)local_88,(ulong)local_84);
        this_local._7_1_ = false;
        goto LAB_013f9fef;
      }
      pbVar13 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_60,
                           (long)(x + 1));
      bVar6 = *pbVar13;
      pfVar14 = tcu::Vector<float,_3>::operator[]
                          ((Vector<float,_3> *)
                           &fb.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage,1);
      fVar1 = *pfVar14;
      pfVar14 = tcu::Vector<float,_3>::operator[](expected,1);
      fVar2 = *pfVar14;
      pfVar14 = tcu::Vector<float,_3>::operator[]((Vector<float,_3> *)(g_color_max.m_data + 1),1);
      if (*pfVar14 < ABS((float)bVar6 / fVar1 - fVar2)) goto LAB_013f9d94;
      pbVar13 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_60,
                           (long)(x + 2));
      bVar6 = *pbVar13;
      pfVar14 = tcu::Vector<float,_3>::operator[]
                          ((Vector<float,_3> *)
                           &fb.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage,2);
      fVar1 = *pfVar14;
      pfVar14 = tcu::Vector<float,_3>::operator[](expected,2);
      fVar2 = *pfVar14;
      pfVar14 = tcu::Vector<float,_3>::operator[]((Vector<float,_3> *)(g_color_max.m_data + 1),2);
      if (*pfVar14 < ABS((float)bVar6 / fVar1 - fVar2)) goto LAB_013f9d94;
      x = x + 4;
    }
    local_84 = local_84 + 1;
  } while( true );
}

Assistant:

bool CheckFB(Vec3 expected)
	{
		const tcu::RenderTarget& renderTarget = m_context.getRenderContext().getRenderTarget();
		const tcu::PixelFormat&  pixelFormat  = renderTarget.getPixelFormat();
		Vec3					 g_color_eps  = Vec3(1.f / static_cast<float>(1 << pixelFormat.redBits),
								1.f / static_cast<float>(1 << pixelFormat.greenBits),
								1.f / static_cast<float>(1 << pixelFormat.blueBits));
		Vec3				 g_color_max = Vec3(255);
		std::vector<GLubyte> fb(getWindowWidth() * getWindowHeight() * 4);
		int					 fb_w = getWindowWidth();
		int					 fb_h = getWindowHeight();
		glReadPixels(0, 0, fb_w, fb_h, GL_RGBA, GL_UNSIGNED_BYTE, &fb[0]);
		for (GLint i = 0, y = 0; y < fb_h; ++y)
			for (GLint x = 0; x < fb_w; ++x, i += 4)
			{
				if (fabs(fb[i + 0] / g_color_max[0] - expected[0]) > g_color_eps[0] ||
					fabs(fb[i + 1] / g_color_max[1] - expected[1]) > g_color_eps[1] ||
					fabs(fb[i + 2] / g_color_max[2] - expected[2]) > g_color_eps[2])
				{

					Output("Incorrect framebuffer color at pixel (%d %d). Color is (%f %f %f). "
						   "Color should be (%f %f %f).\n",
						   x, y, fb[i + 0] / g_color_max[0], fb[i + 1] / g_color_max[1], fb[i + 2] / g_color_max[2],
						   expected[0], expected[1], expected[2]);
					return false;
				}
			}
		return true;
	}